

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::InitAmr(Amr *this)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  double *pdVar8;
  ulong uVar9;
  char *pcVar10;
  Amr *in_RDI;
  ostringstream ss;
  int idim;
  Box bx_1;
  int i_6;
  BoxList bl_1;
  int lev_1;
  int ngrid_1;
  int in_finest_1;
  ifstream is_1;
  Box bx;
  int i_5;
  BoxList bl;
  int lev;
  int ngrid;
  int in_finest;
  ifstream is;
  int i_4;
  int the_regrid_int;
  int numvals;
  int i_3;
  int i_2;
  int nlev;
  int i_1;
  int num_datalogs;
  string grid_file_name;
  string log_file_name_1;
  string log_file_name;
  ParmParse pp;
  int i;
  IntVect shft_1;
  IntVect shft;
  string *in_stack_fffffffffffff0c8;
  Print *in_stack_fffffffffffff0d0;
  string *in_stack_fffffffffffff0d8;
  undefined4 in_stack_fffffffffffff0e0;
  int in_stack_fffffffffffff0e4;
  size_type in_stack_fffffffffffff0e8;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffff0f0;
  undefined4 in_stack_fffffffffffff0f8;
  undefined4 in_stack_fffffffffffff0fc;
  Print *in_stack_fffffffffffff100;
  Box *b;
  undefined4 in_stack_fffffffffffff108;
  undefined4 in_stack_fffffffffffff10c;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff110;
  undefined4 in_stack_fffffffffffff114;
  undefined4 uVar12;
  Print *in_stack_fffffffffffff118;
  Amr *in_stack_fffffffffffff120;
  undefined8 in_stack_fffffffffffff128;
  Amr *in_stack_fffffffffffff130;
  undefined8 in_stack_fffffffffffff138;
  undefined3 uVar13;
  undefined4 in_stack_fffffffffffff140;
  int in_stack_fffffffffffff144;
  char *in_stack_fffffffffffff148;
  undefined4 in_stack_fffffffffffff150;
  undefined4 in_stack_fffffffffffff154;
  undefined4 in_stack_fffffffffffff158;
  undefined4 in_stack_fffffffffffff15c;
  ParmParse *in_stack_fffffffffffff160;
  undefined4 in_stack_fffffffffffff168;
  undefined4 in_stack_fffffffffffff16c;
  undefined4 in_stack_fffffffffffff170;
  int in_stack_fffffffffffff174;
  int in_stack_fffffffffffff178;
  undefined4 in_stack_fffffffffffff17c;
  string local_e30 [16];
  char *in_stack_fffffffffffff1e0;
  ParmParse *in_stack_fffffffffffff1e8;
  ostringstream local_e10 [248];
  char *in_stack_fffffffffffff2e8;
  int in_stack_fffffffffffff2f4;
  char *in_stack_fffffffffffff2f8;
  char *in_stack_fffffffffffff300;
  int local_c94;
  int local_c90 [4];
  Amr *in_stack_fffffffffffff380;
  int local_c74;
  int local_c4c;
  int local_c48;
  int local_c44;
  undefined1 local_c40 [520];
  Long local_a38;
  int local_8a8 [7];
  int local_88c;
  int local_864;
  int local_860;
  int local_85c;
  undefined1 local_858 [912];
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [36];
  int local_444 [6];
  allocator local_429;
  string local_428 [124];
  int local_3ac;
  char *local_3a0;
  undefined4 local_394;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  int local_370 [2];
  int local_368;
  int local_360;
  int iStack_35c;
  int local_358;
  IntVect local_354;
  IntVect *local_348;
  int *local_340;
  int local_338 [2];
  int local_330;
  int local_328;
  int iStack_324;
  int local_320;
  IntVect local_31c;
  IntVect *local_310;
  int *local_308;
  int local_2fc;
  IntVect *local_2f8;
  undefined4 local_2ec;
  IntVect *local_2e8;
  undefined4 local_2dc;
  IntVect *local_2d8;
  int local_2d0 [2];
  int local_2c8;
  uint *local_2c0;
  IntVect local_2b4;
  int local_2a8 [2];
  int local_2a0;
  uint *local_298;
  IntVect local_28c;
  IntVect *local_280;
  int *local_278;
  undefined4 local_26c;
  IntVect *local_268;
  undefined4 local_25c;
  IntVect *local_258;
  undefined4 local_24c;
  IntVect *local_248;
  int *local_240;
  IntVect *local_238;
  undefined4 local_22c;
  int *local_228;
  undefined4 local_21c;
  int *local_218;
  undefined4 local_20c;
  int *local_208;
  IntVect *local_200;
  int *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  undefined4 local_1dc;
  IntVect *local_1d8;
  undefined4 local_1cc;
  IntVect *local_1c8;
  int *local_1c0;
  IntVect *local_1b8;
  undefined4 local_1ac;
  int *local_1a8;
  undefined4 local_19c;
  int *local_198;
  undefined4 local_18c;
  int *local_188;
  IntVect *local_180;
  int *local_178;
  undefined4 local_16c;
  IntVect *local_168;
  undefined4 local_15c;
  IntVect *local_158;
  undefined4 local_14c;
  IntVect *local_148;
  IntVect *local_140;
  int *local_138;
  undefined4 local_12c;
  IntVect *local_128;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  IntVect *local_100;
  int *local_f8;
  undefined4 local_ec;
  IntVect *local_e8;
  undefined4 local_dc;
  IntVect *local_d8;
  undefined4 local_cc;
  IntVect *local_c8;
  IntVect *local_c0;
  int *local_b8;
  undefined4 local_ac;
  IntVect *local_a8;
  undefined4 local_9c;
  IntVect *local_98;
  undefined4 local_8c;
  IntVect *local_88;
  IntVect *local_80;
  int *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  IntVect *local_40;
  int *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  if (in_RDI->levelbld == (LevelBld *)0x0) {
    local_388 = "levelbld != nullptr";
    local_390 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Amr/AMReX_Amr.cpp"
    ;
    local_394 = 0xe5;
    local_3a0 = "\"ERROR: levelbld is nullptr\"";
    Assert_host(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f4,
                in_stack_fffffffffffff2e8);
  }
  (**(code **)(*(long *)in_RDI->levelbld + 0x10))();
  in_RDI->plot_int = -1;
  in_RDI->small_plot_int = -1;
  in_RDI->last_plotfile = 0;
  in_RDI->last_smallplotfile = -1;
  in_RDI->last_checkpoint = 0;
  in_RDI->record_run_info = 0;
  in_RDI->record_grid_info = 0;
  in_RDI->file_name_digits = 5;
  in_RDI->record_run_info_terse = 0;
  in_RDI->bUserStopRequest = false;
  in_RDI->message_int = 10;
  for (local_3ac = 0; local_3ac < 3; local_3ac = local_3ac + 1) {
    in_RDI->isPeriodic[local_3ac] = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"amr",&local_429);
  ParmParse::ParmParse
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             in_stack_fffffffffffff0d8);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  local_444[1] = 1;
  local_444[0] = ParallelDescriptor::NProcs();
  piVar7 = std::min<int>(local_444,&(anonymous_namespace)::probinit_natonce);
  piVar7 = std::max<int>(local_444 + 1,piVar7);
  (anonymous_namespace)::probinit_natonce = *piVar7;
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  ParmParse::queryAdd((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
                      (char *)in_stack_fffffffffffff0d8,(string *)in_stack_fffffffffffff0d0);
  ParmParse::queryAdd((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
                      (char *)in_stack_fffffffffffff0d8,(string *)in_stack_fffffffffffff0d0);
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  bVar3 = ParmParse::contains(in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0);
  if (bVar3) {
    std::__cxx11::string::string(local_468);
    ParmParse::get((ParmParse *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                   in_stack_fffffffffffff148,
                   (string *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                   (int)((ulong)in_stack_fffffffffffff138 >> 0x20));
    setRecordRunInfo(in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
    std::__cxx11::string::~string(local_468);
  }
  bVar3 = ParmParse::contains(in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0);
  if (bVar3) {
    std::__cxx11::string::string(local_488);
    ParmParse::get((ParmParse *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                   in_stack_fffffffffffff148,
                   (string *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                   (int)((ulong)in_stack_fffffffffffff138 >> 0x20));
    setRecordRunInfoTerse(in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
    std::__cxx11::string::~string(local_488);
  }
  bVar3 = ParmParse::contains(in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0);
  if (bVar3) {
    std::__cxx11::string::string(local_4a8);
    ParmParse::get((ParmParse *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                   in_stack_fffffffffffff148,
                   (string *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                   (int)((ulong)in_stack_fffffffffffff138 >> 0x20));
    setRecordGridInfo(in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
    std::__cxx11::string::~string(local_4a8);
  }
  bVar3 = ParmParse::contains(in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0);
  iVar5 = (int)((ulong)in_stack_fffffffffffff138 >> 0x20);
  uVar12 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff17c);
  if (bVar3) {
    in_stack_fffffffffffff178 =
         ParmParse::countval((ParmParse *)
                             CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170),
                             (char *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
                             (int)((ulong)in_stack_fffffffffffff160 >> 0x20));
    local_4ac = in_stack_fffffffffffff178;
    std::
    vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
    ::resize((vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
              *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
    ParmParse::queryarr(in_stack_fffffffffffff160,
                        (char *)CONCAT44(in_stack_fffffffffffff15c,in_stack_fffffffffffff158),
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                        (int)((ulong)in_stack_fffffffffffff148 >> 0x20),
                        (int)in_stack_fffffffffffff148);
    for (local_4b0 = 0; iVar5 = (int)((ulong)in_stack_fffffffffffff138 >> 0x20),
        local_4b0 < local_4ac; local_4b0 = local_4b0 + 1) {
      in_stack_fffffffffffff174 = local_4b0;
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff0d0,(size_type)in_stack_fffffffffffff0c8);
      setRecordDataInfo(in_stack_fffffffffffff130,(int)((ulong)in_stack_fffffffffffff128 >> 0x20),
                        (string *)in_stack_fffffffffffff120);
    }
  }
  std::__cxx11::string::operator=((string *)&in_RDI->probin_file,"probin");
  bVar3 = ParmParse::contains(in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0);
  uVar11 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff170);
  if (bVar3) {
    ParmParse::get((ParmParse *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                   in_stack_fffffffffffff148,
                   (string *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),iVar5);
  }
  ParmParse::queryAdd((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
                      (char *)in_stack_fffffffffffff0d8,(string *)in_stack_fffffffffffff0d0);
  ParmParse::queryAdd((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
                      (char *)in_stack_fffffffffffff0d8,(string *)in_stack_fffffffffffff0d0);
  local_4b4 = (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0f0,
             in_stack_fffffffffffff0e8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0f0,
             in_stack_fffffffffffff0e8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0f0,
             in_stack_fffffffffffff0e8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0f0,
             in_stack_fffffffffffff0e8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0f0,
             in_stack_fffffffffffff0e8);
  std::
  vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  for (local_4b8 = 0; local_4b8 < local_4b4; local_4b8 = local_4b8 + 1) {
    pdVar8 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0d0,
                        (size_type)in_stack_fffffffffffff0c8);
    *pdVar8 = 1e+200;
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0d0,
                        (size_type)in_stack_fffffffffffff0c8);
    *piVar7 = 0;
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0d0,
                        (size_type)in_stack_fffffffffffff0c8);
    *piVar7 = 0;
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0d0,
                        (size_type)in_stack_fffffffffffff0c8);
    *piVar7 = 0;
    pdVar8 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0d0,
                        (size_type)in_stack_fffffffffffff0c8);
    *pdVar8 = 0.0;
  }
  if (0 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0f0,
               in_stack_fffffffffffff0e8);
    for (local_4bc = 0; local_4bc < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        local_4bc = local_4bc + 1) {
      piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0d0,
                          (size_type)in_stack_fffffffffffff0c8);
      *piVar7 = 1;
    }
  }
  initPltAndChk((Amr *)CONCAT44(uVar12,in_stack_fffffffffffff178));
  initInSitu(in_RDI);
  initSubcycle(in_stack_fffffffffffff380);
  if (0 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    local_4c0 = ParmParse::countval((ParmParse *)CONCAT44(in_stack_fffffffffffff174,uVar11),
                                    (char *)CONCAT44(in_stack_fffffffffffff16c,
                                                     in_stack_fffffffffffff168),
                                    (int)((ulong)in_stack_fffffffffffff160 >> 0x20));
    iVar5 = (int)((ulong)in_stack_fffffffffffff148 >> 0x20);
    if (local_4c0 == 1) {
      local_4c4 = 0;
      ParmParse::query(in_stack_fffffffffffff160,
                       (char *)CONCAT44(in_stack_fffffffffffff15c,in_stack_fffffffffffff158),
                       (int *)CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),iVar5);
      for (local_4c8 = 0; local_4c8 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
          local_4c8 = local_4c8 + 1) {
        iVar5 = local_4c4;
        piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0d0,
                            (size_type)in_stack_fffffffffffff0c8);
        *piVar7 = iVar5;
      }
    }
    else if (local_4c0 == 0) {
      if ((in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose != 0) {
        ErrorStream();
        Print::Print(in_stack_fffffffffffff100,
                     (ostream *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff0d0,(char (*) [45])in_stack_fffffffffffff0c8);
        Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140));
      }
    }
    else if (local_4c0 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
      local_378 = "You did not specify enough values of regrid_int";
      Error_host((char *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0));
    }
    else {
      ParmParse::queryarr(in_stack_fffffffffffff160,
                          (char *)CONCAT44(in_stack_fffffffffffff15c,in_stack_fffffffffffff158),
                          (vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),iVar5,
                          (int)in_stack_fffffffffffff148);
    }
  }
  if ((0 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) &&
     (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_858,pcVar10,_S_in);
    bVar4 = std::ios::good();
    if ((bVar4 & 1) == 0) {
      FileOpenFailed((string *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
    }
    std::istream::operator>>(local_858,&local_85c);
    do {
      iVar5 = std::istream::get();
    } while (iVar5 != 10);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              (in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
    (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_upto_level = local_85c;
    if ((in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level < local_85c) {
      local_380 = "You have fewer levels in your inputs file then in your grids file!";
      Error_host((char *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0));
    }
    for (local_864 = 1; local_864 <= local_85c; local_864 = local_864 + 1) {
      BoxList::BoxList((BoxList *)in_stack_fffffffffffff0c8);
      std::istream::operator>>(local_858,&local_860);
      do {
        iVar5 = std::istream::get();
      } while (iVar5 != 10);
      for (local_88c = 0; local_88c < local_860; local_88c = local_88c + 1) {
        Box::Box((Box *)in_stack_fffffffffffff0d0);
        amrex::operator>>((istream *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                          (Box *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
        do {
          in_stack_fffffffffffff144 = std::istream::get();
        } while (in_stack_fffffffffffff144 != 10);
        local_310 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff0d0,(size_type)in_stack_fffffffffffff0c8);
        piVar7 = local_8a8;
        local_2ec = 1;
        uVar13 = (undefined3)in_stack_fffffffffffff140;
        in_stack_fffffffffffff140 = CONCAT13(1,uVar13);
        if ((local_310->vect[0] == 1) &&
           (in_stack_fffffffffffff140 = CONCAT13(1,uVar13), local_310->vect[1] == 1)) {
          in_stack_fffffffffffff140 = CONCAT13(local_310->vect[2] != 1,uVar13);
        }
        local_308 = piVar7;
        local_2e8 = local_310;
        if ((char)((uint)in_stack_fffffffffffff140 >> 0x18) != '\0') {
          IntVect::IntVect(&local_31c,1);
          local_2c0 = (uint *)(piVar7 + 6);
          uVar1 = *local_2c0;
          IntVect::IntVect(&local_2b4,uVar1 & 1,uVar1 >> 1 & 1,uVar1 >> 2 & 1);
          local_2c8 = local_2b4.vect[2];
          local_2d0[0] = local_2b4.vect[0];
          local_2d0[1] = local_2b4.vect[1];
          local_330 = local_2b4.vect[2];
          local_338[0] = local_2b4.vect[0];
          local_338[1] = local_2b4.vect[1];
          local_328 = local_2b4.vect[0];
          iStack_324 = local_2b4.vect[1];
          uVar2 = _local_328;
          local_320 = local_2b4.vect[2];
          local_238 = &local_31c;
          local_240 = &local_328;
          local_20c = 0;
          local_328 = local_2b4.vect[0];
          local_31c.vect[0] = local_31c.vect[0] - local_328;
          local_21c = 1;
          iStack_324 = local_2b4.vect[1];
          local_31c.vect[1] = local_31c.vect[1] - iStack_324;
          local_22c = 2;
          local_31c.vect[2] = local_31c.vect[2] - local_2b4.vect[2];
          local_140 = local_310;
          local_108 = local_310;
          local_10c = 0;
          _local_328 = uVar2;
          local_228 = local_240;
          local_218 = local_240;
          local_208 = local_240;
          local_138 = piVar7;
          *piVar7 = local_310->vect[0] * *piVar7;
          local_118 = local_140;
          local_11c = 1;
          piVar7[1] = local_140->vect[1] * piVar7[1];
          local_128 = local_140;
          local_12c = 2;
          piVar7[2] = local_140->vect[2] * piVar7[2];
          local_78 = piVar7 + 3;
          local_80 = &local_31c;
          local_4c = 0;
          local_48 = local_80;
          *local_78 = local_31c.vect[0] + *local_78;
          local_58 = local_80;
          local_5c = 1;
          piVar7[4] = local_80->vect[1] + piVar7[4];
          local_68 = local_80;
          local_6c = 2;
          piVar7[5] = local_80->vect[2] + piVar7[5];
          local_178 = piVar7 + 3;
          local_180 = local_310;
          local_148 = local_310;
          local_14c = 0;
          *local_178 = local_310->vect[0] * *local_178;
          local_158 = local_180;
          local_15c = 1;
          piVar7[4] = local_180->vect[1] * piVar7[4];
          local_168 = local_180;
          local_16c = 2;
          piVar7[5] = local_180->vect[2] * piVar7[5];
          local_278 = piVar7 + 3;
          local_280 = &local_31c;
          local_24c = 0;
          local_248 = local_280;
          *local_278 = *local_278 - local_31c.vect[0];
          local_258 = local_280;
          local_25c = 1;
          piVar7[4] = piVar7[4] - local_280->vect[1];
          local_268 = local_280;
          local_26c = 2;
          piVar7[5] = piVar7[5] - local_280->vect[2];
        }
        BoxList::push_back((BoxList *)in_stack_fffffffffffff0d0,(Box *)in_stack_fffffffffffff0c8);
      }
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff0d0,(size_type)in_stack_fffffffffffff0c8);
      BoxArray::define((BoxArray *)in_stack_fffffffffffff120,(BoxList *)in_stack_fffffffffffff118);
      BoxList::~BoxList((BoxList *)0x137e839);
    }
    std::ifstream::close();
    if (0 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      OutStream();
      Print::Print(in_stack_fffffffffffff100,
                   (ostream *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      in_stack_fffffffffffff120 =
           (Amr *)Print::operator<<(in_stack_fffffffffffff0d0,
                                    (char (*) [26])in_stack_fffffffffffff0c8);
      local_a38 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x137e8b7)
      ;
      in_stack_fffffffffffff118 =
           Print::operator<<(in_stack_fffffffffffff0d0,(long *)in_stack_fffffffffffff0c8);
      Print::operator<<(in_stack_fffffffffffff0d0,(char (*) [2])in_stack_fffffffffffff0c8);
      Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140));
    }
    std::ifstream::~ifstream(local_858);
  }
  if ((0 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) &&
     (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_c40,pcVar10,_S_in);
    bVar4 = std::ios::good();
    uVar12 = CONCAT13(bVar4,(int3)in_stack_fffffffffffff114);
    if ((bVar4 & 1) == 0) {
      FileOpenFailed((string *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
    }
    std::istream::operator>>(local_c40,&local_c44);
    do {
      iVar5 = std::istream::get();
    } while (iVar5 != 10);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              (in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
    for (local_c4c = 1; local_c4c <= local_c44; local_c4c = local_c4c + 1) {
      BoxList::BoxList((BoxList *)in_stack_fffffffffffff0c8);
      std::istream::operator>>(local_c40,&local_c48);
      do {
        iVar6 = std::istream::get();
      } while (iVar6 != 10);
      uVar11 = 10;
      for (local_c74 = 0; local_c74 < local_c48; local_c74 = local_c74 + 1) {
        b = (Box *)local_c90;
        Box::Box((Box *)in_stack_fffffffffffff0d0);
        amrex::operator>>((istream *)CONCAT44(uVar12,iVar5),
                          (Box *)CONCAT44(uVar11,in_stack_fffffffffffff108));
        do {
          iVar6 = std::istream::get();
        } while (iVar6 != 10);
        local_348 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff0d0,(size_type)in_stack_fffffffffffff0c8);
        piVar7 = local_c90;
        local_2dc = 1;
        bVar3 = true;
        if ((local_348->vect[0] == 1) && (bVar3 = true, local_348->vect[1] == 1)) {
          bVar3 = local_348->vect[2] != 1;
        }
        local_340 = piVar7;
        local_2d8 = local_348;
        if (bVar3) {
          IntVect::IntVect(&local_354,1);
          local_298 = (uint *)(piVar7 + 6);
          uVar1 = *local_298;
          IntVect::IntVect(&local_28c,uVar1 & 1,uVar1 >> 1 & 1,uVar1 >> 2 & 1);
          local_2a0 = local_28c.vect[2];
          local_2a8[0] = local_28c.vect[0];
          local_2a8[1] = local_28c.vect[1];
          local_368 = local_28c.vect[2];
          local_370[0] = local_28c.vect[0];
          local_370[1] = local_28c.vect[1];
          local_360 = local_28c.vect[0];
          iStack_35c = local_28c.vect[1];
          uVar2 = _local_360;
          local_358 = local_28c.vect[2];
          local_1b8 = &local_354;
          local_1c0 = &local_360;
          local_18c = 0;
          local_360 = local_28c.vect[0];
          local_354.vect[0] = local_354.vect[0] - local_360;
          local_19c = 1;
          iStack_35c = local_28c.vect[1];
          local_354.vect[1] = local_354.vect[1] - iStack_35c;
          local_1ac = 2;
          local_354.vect[2] = local_354.vect[2] - local_28c.vect[2];
          local_c0 = local_348;
          local_88 = local_348;
          local_8c = 0;
          _local_360 = uVar2;
          local_1a8 = local_1c0;
          local_198 = local_1c0;
          local_188 = local_1c0;
          local_b8 = piVar7;
          *piVar7 = local_348->vect[0] * *piVar7;
          local_98 = local_c0;
          local_9c = 1;
          piVar7[1] = local_c0->vect[1] * piVar7[1];
          local_a8 = local_c0;
          local_ac = 2;
          piVar7[2] = local_c0->vect[2] * piVar7[2];
          local_38 = piVar7 + 3;
          local_40 = &local_354;
          local_c = 0;
          local_8 = local_40;
          *local_38 = local_354.vect[0] + *local_38;
          local_18 = local_40;
          local_1c = 1;
          piVar7[4] = local_40->vect[1] + piVar7[4];
          local_28 = local_40;
          local_2c = 2;
          piVar7[5] = local_40->vect[2] + piVar7[5];
          local_f8 = piVar7 + 3;
          local_100 = local_348;
          local_c8 = local_348;
          local_cc = 0;
          *local_f8 = local_348->vect[0] * *local_f8;
          local_d8 = local_100;
          local_dc = 1;
          piVar7[4] = local_100->vect[1] * piVar7[4];
          local_e8 = local_100;
          local_ec = 2;
          piVar7[5] = local_100->vect[2] * piVar7[5];
          local_1f8 = piVar7 + 3;
          local_200 = &local_354;
          local_1cc = 0;
          local_1c8 = local_200;
          *local_1f8 = *local_1f8 - local_354.vect[0];
          local_1d8 = local_200;
          local_1dc = 1;
          piVar7[4] = piVar7[4] - local_200->vect[1];
          local_1e8 = local_200;
          local_1ec = 2;
          piVar7[5] = piVar7[5] - local_200->vect[2];
        }
        for (local_c94 = 0; local_c94 < 3; local_c94 = local_c94 + 1) {
          in_stack_fffffffffffff0e4 = Box::length((Box *)local_c90,local_c94);
          local_2f8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 in_stack_fffffffffffff0d0,(size_type)in_stack_fffffffffffff0c8);
          local_2fc = local_c94;
          if (local_2f8->vect[local_c94] < in_stack_fffffffffffff0e4) {
            std::__cxx11::ostringstream::ostringstream(local_e10);
            in_stack_fffffffffffff0d8 = (string *)std::operator<<((ostream *)local_e10,"Grid ");
            in_stack_fffffffffffff0d0 =
                 (Print *)amrex::operator<<((ostream *)CONCAT44(uVar11,in_stack_fffffffffffff108),b)
            ;
            in_stack_fffffffffffff0c8 =
                 (string *)std::operator<<((ostream *)in_stack_fffffffffffff0d0," too large");
            std::operator<<((ostream *)in_stack_fffffffffffff0c8,'\n');
            std::__cxx11::ostringstream::str();
            Error(in_stack_fffffffffffff0c8);
            std::__cxx11::string::~string(local_e30);
            std::__cxx11::ostringstream::~ostringstream(local_e10);
          }
        }
        BoxList::push_back((BoxList *)in_stack_fffffffffffff0d0,(Box *)in_stack_fffffffffffff0c8);
      }
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff0d0,(size_type)in_stack_fffffffffffff0c8);
      BoxArray::define((BoxArray *)in_stack_fffffffffffff120,(BoxList *)in_stack_fffffffffffff118);
      BoxList::~BoxList((BoxList *)0x137f24b);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_c40);
  }
  in_RDI->loadbalance_with_workestimates = 0;
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  in_RDI->loadbalance_level0_int = 2;
  ParmParse::queryAdd<int,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,&in_stack_fffffffffffff0d0->rank);
  in_RDI->loadbalance_max_fac = 1.5;
  ParmParse::queryAdd<double,_0>
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
             (char *)in_stack_fffffffffffff0d8,(double *)in_stack_fffffffffffff0d0);
  ParmParse::~ParmParse((ParmParse *)0x137f34a);
  return;
}

Assistant:

void
Amr::InitAmr ()
{
    BL_PROFILE("Amr::InitAmr()");

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(levelbld != nullptr, "ERROR: levelbld is nullptr");
    //
    // Global function that define state variables.
    //
    levelbld->variableSetUp();
    //
    // Set default values.
    //
    plot_int               = -1;
    small_plot_int         = -1;
    last_plotfile          = 0;
    last_smallplotfile     = -1;
    last_checkpoint        = 0;
    record_run_info        = false;
    record_grid_info       = false;
    file_name_digits       = 5;
    record_run_info_terse  = false;
    bUserStopRequest       = false;
    message_int            = 10;
#if defined(AMREX_USE_SENSEI_INSITU) && !defined(AMREX_NO_SENSEI_AMR_INST)
    insitu_bridge          = nullptr;
#endif

    for (int i = 0; i < AMREX_SPACEDIM; i++)
        isPeriodic[i] = false;

    ParmParse pp("amr");
    //
    // Check for command line flags.
    //
    pp.queryAdd("regrid_on_restart",regrid_on_restart);
    pp.queryAdd("use_efficient_regrid",use_efficient_regrid);
    pp.queryAdd("plotfile_on_restart",plotfile_on_restart);
    pp.queryAdd("insitu_on_restart",insitu_on_restart);
    pp.queryAdd("checkpoint_on_restart",checkpoint_on_restart);

    pp.queryAdd("compute_new_dt_on_regrid",compute_new_dt_on_regrid);

    pp.queryAdd("mffile_nstreams", mffile_nstreams);

#ifndef AMREX_NO_PROBINIT
    pp.queryAdd("probinit_natonce", probinit_natonce);
    probinit_natonce = std::max(1, std::min(ParallelDescriptor::NProcs(), probinit_natonce));
#endif

    pp.queryAdd("file_name_digits", file_name_digits);

    pp.queryAdd("initial_grid_file",initial_grids_file);
    pp.queryAdd("regrid_file"      , regrid_grids_file);

    pp.queryAdd("message_int", message_int);

    if (pp.contains("run_log"))
    {
        std::string log_file_name;
        pp.get("run_log",log_file_name);
        setRecordRunInfo(log_file_name);
    }
    if (pp.contains("run_log_terse"))
    {
        std::string log_file_name;
        pp.get("run_log_terse",log_file_name);
        setRecordRunInfoTerse(log_file_name);
    }
    if (pp.contains("grid_log"))
    {
        std::string grid_file_name;
        pp.get("grid_log",grid_file_name);
        setRecordGridInfo(grid_file_name);
    }

    if (pp.contains("data_log"))
    {
      int num_datalogs = pp.countval("data_log");
      datalog.resize(num_datalogs);
      datalogname.resize(num_datalogs);
      pp.queryarr("data_log",datalogname,0,num_datalogs);
      for (int i = 0; i < num_datalogs; i++)
        setRecordDataInfo(i,datalogname[i]);
    }

#ifndef AMREX_NO_PROBINIT
    probin_file = "probin";  // Make "probin" the default

    if (pp.contains("probin_file"))
    {
        pp.get("probin_file",probin_file);
    }
#endif
    //
    // If set, then restart from checkpoint file.
    //
    pp.queryAdd("restart", restart_chkfile);
    //
    // If set, then restart from plotfile.
    //
    pp.queryAdd("restart_from_plotfile", restart_pltfile);

    int nlev     = max_level+1;
    dt_level.resize(nlev);
    level_steps.resize(nlev);
    level_count.resize(nlev);
    n_cycle.resize(nlev);
    dt_min.resize(nlev);
    amr_level.resize(nlev);
    //
    // Set bogus values.
    //
    for (int i = 0; i < nlev; i++)
    {

        // Something nonzero so old & new will differ
#ifdef AMREX_USE_FLOAT
        dt_level[i]    = 1.e30f;
#else
        dt_level[i]    = 1.e200;
#endif
        level_steps[i] = 0;
        level_count[i] = 0;
        n_cycle[i]     = 0;
        dt_min[i]      = 0.0;
    }

    // Make the default regrid_int = 1 for all levels.
    if (max_level > 0)
    {
       regrid_int.resize(max_level);
       for (int i = 0; i < max_level; i++)
           regrid_int[i]  = 1;
    }

    //
    // Setup plot and checkpoint controls.
    //
    initPltAndChk();

    //
    // Setup insitu controls
    //
    initInSitu();

    //
    // Setup subcycling controls.
    //
    initSubcycle();

    //
    // Read in the regrid interval if max_level > 0.
    //
    if (max_level > 0)
    {
       int numvals = pp.countval("regrid_int");
       if (numvals == 1)
       {
           //
           // Set all values to the single available value.
           //
           int the_regrid_int = 0;
           pp.query("regrid_int",the_regrid_int);
           for (int i = 0; i < max_level; i++)
           {
               regrid_int[i] = the_regrid_int;
           }
       }
       else if (numvals == 0)
       {
           if (verbose) {
               amrex::Print(amrex::ErrorStream()) << "Using default regrid_int = 1 at all levels!\n";
           }
       }
       else if (numvals < max_level)
       {
           amrex::Error("You did not specify enough values of regrid_int");
       }
       else
       {
           //
           // Otherwise we expect a vector of max_level values
           //
           pp.queryarr("regrid_int",regrid_int,0,max_level);
       }
    }

    if (max_level > 0 && !initial_grids_file.empty())
    {
#define STRIP while( is.get() != '\n' ) {}
        std::ifstream is(initial_grids_file.c_str(),std::ios::in);

        if (!is.good())
            amrex::FileOpenFailed(initial_grids_file);

        int in_finest,ngrid;

        is >> in_finest;
        STRIP;
        initial_ba.resize(in_finest);

        use_fixed_upto_level = in_finest;
        if (in_finest > max_level)
           amrex::Error("You have fewer levels in your inputs file then in your grids file!");

        for (int lev = 1; lev <= in_finest; lev++)
        {
            BoxList bl;
            is >> ngrid;
            STRIP;
            for (int i = 0; i < ngrid; i++)
            {
                Box bx;
                is >> bx;
                STRIP;
                bx.refine(ref_ratio[lev-1]);
                bl.push_back(bx);
            }
            initial_ba[lev-1].define(bl);
        }
        is.close();
        if (verbose > 0) {
            amrex::Print() << "Read initial_ba. Size is " << initial_ba.size() << "\n";
        }

#undef STRIP
    }

    if (max_level > 0 && !regrid_grids_file.empty())
    {
#define STRIP while( is.get() != '\n' ) {}
        std::ifstream is(regrid_grids_file.c_str(),std::ios::in);

        if (!is.good())
            amrex::FileOpenFailed(regrid_grids_file);

        int in_finest,ngrid;

        is >> in_finest;
        STRIP;
        regrid_ba.resize(in_finest);
        for (int lev = 1; lev <= in_finest; lev++)
        {
            BoxList bl;
            is >> ngrid;
            STRIP;
            for (int i = 0; i < ngrid; i++)
            {
                Box bx;
                is >> bx;
                STRIP;
                 bx.refine(ref_ratio[lev-1]);
                 for (int idim = 0 ; idim < AMREX_SPACEDIM; ++idim)
                 {
                     if (bx.length(idim) > max_grid_size[lev][idim])
                     {
                         std::ostringstream ss;
                         ss << "Grid " << bx << " too large" << '\n';
                         amrex::Error(ss.str());
                     }
                 }
                 bl.push_back(bx);
            }
            regrid_ba[lev-1].define(bl);
        }
        is.close();
#undef STRIP
    }

    loadbalance_with_workestimates = 0;
    pp.queryAdd("loadbalance_with_workestimates", loadbalance_with_workestimates);

    loadbalance_level0_int = 2;
    pp.queryAdd("loadbalance_level0_int", loadbalance_level0_int);

    loadbalance_max_fac = 1.5;
    pp.queryAdd("loadbalance_max_fac", loadbalance_max_fac);
}